

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_object.hpp
# Opt level: O0

void __thiscall
jsoncons::
index_key_value<jsoncons::basic_json<wchar_t,jsoncons::sorted_policy,std::allocator<char>>>::
index_key_value<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>const&,jsoncons::semantic_tag&>
          (index_key_value<jsoncons::basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>_>
           *this,key_type *Name,int64_t Index,
          basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *args,semantic_tag *args_1)

{
  semantic_tag tag;
  allocator_type *in_RCX;
  undefined8 in_RDX;
  wstring *in_RSI;
  wstring *in_RDI;
  string_view_type *sv;
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  undefined1 local_29 [17];
  undefined8 local_18;
  
  local_29._9_8_ = in_RCX;
  local_18 = in_RDX;
  std::__cxx11::wstring::wstring(in_RDI,in_RSI);
  *(undefined8 *)(in_RDI + 0x20) = local_18;
  tag = none;
  sv = (string_view_type *)local_29;
  std::allocator<char>::allocator();
  basic_json<wchar_t,_jsoncons::sorted_policy,_std::allocator<char>_>::basic_json
            (in_stack_ffffffffffffffc0,sv,tag,(allocator_type *)local_29._9_8_);
  std::allocator<char>::~allocator((allocator<char> *)local_29);
  return;
}

Assistant:

index_key_value(key_type&& Name, int64_t Index, Args&& ... args) 
            : name(std::move(Name)), index(Index), value(std::forward<Args>(args)...)
        {
        }